

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O2

File * __thiscall njoy::ENDFtk::tree::Material::file(Material *this,int mf)

{
  mapped_type *pmVar1;
  int mf_local;
  
  pmVar1 = std::
           map<int,_njoy::ENDFtk::tree::File,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::tree::File>_>_>
           ::at(&this->files_,&mf_local);
  return pmVar1;
}

Assistant:

const File& file( int mf ) const {

  try {

    return this->files_.at( mf );
  }
  catch( std::out_of_range& o ) {

    Log::error
      ( "Requested file number (MF) does not"
        " correspond to a stored file syntax tree" );
    Log::info( "Requested file number: {}", mf );
    Log::info( "Material number of queried material syntax tree: ",
               this->materialNumber() );
    throw o;
  }
}